

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O2

void bsp_begin(bsp_pid_t maxprocs)

{
  MPI_Comm comm;
  ulong uVar1;
  double beta_00;
  double alpha_00;
  size_t max_msg_size_00;
  size_t min_n_hp_msg_size_00;
  bool bVar2;
  int iVar3;
  Spmd *pSVar4;
  Rdma *this;
  Bsmp *this_00;
  size_t small_exch_size_00;
  int small_exch_size;
  allocator<char> local_89;
  double beta;
  double alpha;
  size_t max_msg_size;
  int mpi_pid;
  size_t min_n_hp_msg_size;
  string method;
  int mpi_init;
  
  mpi_init = 0;
  MPI_Initialized(&mpi_init);
  if (mpi_init == 0) {
    MPI_Init(0,0);
    atexit(bsp_check_exit);
  }
  mpi_pid = 0;
  MPI_Comm_rank(&ompi_mpi_comm_world);
  if (s_spmd != (Spmd *)0x0) {
    bsp_abort("bsp_begin: May be called only once\n");
  }
  if ((maxprocs < 1) && (mpi_pid == 0)) {
    bsp_abort("bsp_begin: The requested number of processes must be strictly greater than 0. Instead, it was %d\n"
              ,maxprocs);
  }
  pSVar4 = (Spmd *)operator_new(0x28);
  bsplib::Spmd::Spmd(pSVar4,maxprocs);
  s_spmd = pSVar4;
  if (pSVar4->m_active == false) {
    iVar3 = bsplib::Spmd::end_sync(pSVar4);
    if (iVar3 != 0) {
      bsp_abort("bsp_end: Unexpected internal error\n");
    }
    bsplib::Spmd::close(s_spmd,maxprocs);
    pSVar4 = s_spmd;
    if (s_spmd != (Spmd *)0x0) {
      bsplib::Spmd::~Spmd(s_spmd);
    }
    operator_delete(pSVar4,0x28);
    s_spmd = (Spmd *)0x0;
    exit(0);
  }
  max_msg_size = 0x7fffffff;
  bVar2 = bsplib::read_env<unsigned_long>("BSPONMPI_MAX_MSG_SIZE",&max_msg_size);
  if ((bVar2) || (max_msg_size == 0)) {
    fwrite("bsp_begin: WARNING! BSPONMPI_MAX_MSG_SIZE was not set to a positive, non-zero integer\n"
           ,0x56,1,_stderr);
  }
  uVar1 = 0x7fffffff / (long)s_spmd->m_nprocs;
  iVar3 = (int)uVar1;
  small_exch_size = 0x400;
  if (iVar3 < 0x400) {
    small_exch_size = iVar3;
  }
  bVar2 = bsplib::read_env<int>("BSPONMPI_SMALL_EXCHANGE_SIZE",&small_exch_size);
  if (((bVar2) || (small_exch_size < 0)) || (iVar3 < small_exch_size)) {
    fprintf(_stderr,
            "bsp_begin: WARNING! BSPONMPI_SMALL_EXCHANGE_SIZE was not an integer between 0 and %d \n"
            ,uVar1 & 0xffffffff);
  }
  alpha = 10000.0;
  beta = 1.0;
  bVar2 = bsplib::read_env<double>("BSPONMPI_P2P_LATENCY",&alpha);
  if ((bVar2) || (alpha < 0.0)) {
    alpha = 10000.0;
    fprintf(_stderr,"bsp_begin: BSPONMPI_P2P_LATENCY was not a positive number. Using default: %g\n"
            ,0x40c3880000000000);
  }
  bVar2 = bsplib::read_env<double>("BSPONMPI_P2P_MSGGAP",&beta);
  if ((bVar2) || (beta < 0.0)) {
    beta = 1.0;
    fprintf(_stderr,"bsp_begin: BSPONMPI_P2P_MSGGAP was not a positive number. Using default: %g\n",
            0x3ff0000000000000);
  }
  min_n_hp_msg_size = 0;
  bVar2 = bsplib::read_env<unsigned_long>("BSPONMPI_P2P_N_HP",&min_n_hp_msg_size);
  if (bVar2) {
    min_n_hp_msg_size = 0;
    fprintf(_stderr,
            "bsp_begin: BSPONMPI_P2P_N_HP was not a non-negative integer. Using default %ld\n",0);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&method,"rma",&local_89);
  bVar2 = bsplib::read_env<std::__cxx11::string>("BSPONMPI_A2A_METHOD",&method);
  if (!bVar2) {
    bVar2 = std::operator!=(&method,"rma");
    if (!bVar2) goto LAB_00108e2e;
    bVar2 = std::operator!=(&method,"msg");
    if (!bVar2) goto LAB_00108e2e;
  }
  std::__cxx11::string::assign((char *)&method);
  fprintf(_stderr,
          "bsp_begin: BSPONMPI_A2A_METHOD was set to neither \'msg\' nor \'rma\'. Using default \'%s\'\n"
          ,method._M_dataplus._M_p);
LAB_00108e2e:
  this = (Rdma *)operator_new(0x520);
  min_n_hp_msg_size_00 = min_n_hp_msg_size;
  max_msg_size_00 = max_msg_size;
  alpha_00 = alpha;
  beta_00 = beta;
  comm = s_spmd->m_comm;
  small_exch_size_00 = (size_t)small_exch_size;
  bVar2 = std::operator==(&method,"rma");
  bsplib::Rdma::Rdma(this,comm,max_msg_size_00,small_exch_size_00,alpha_00,beta_00,
                     min_n_hp_msg_size_00,(uint)!bVar2);
  s_rdma = this;
  this_00 = (Bsmp *)operator_new(0x218);
  bsplib::Bsmp::Bsmp(this_00,s_spmd->m_comm,max_msg_size,(long)small_exch_size);
  s_bsmp = this_00;
  std::__cxx11::string::~string((string *)&method);
  return;
}

Assistant:

void bsp_begin( bsp_pid_t maxprocs )
{
    int mpi_init = 0;
    MPI_Initialized(&mpi_init);
    if (!mpi_init) {
        MPI_Init(NULL, NULL);
        atexit( bsp_check_exit );
    }

    int mpi_pid = 0;
    MPI_Comm_rank( MPI_COMM_WORLD, &mpi_pid );

    if (s_spmd)
        bsp_abort( "bsp_begin: May be called only once\n" );
 
    if (mpi_pid == 0 && maxprocs <= 0)
        bsp_abort("bsp_begin: The requested number of processes must be "
                "strictly greater than 0. Instead, it was %d\n", maxprocs );

    s_spmd = new bsplib::Spmd( maxprocs );
    if ( ! s_spmd->active() ) {
        if (s_spmd->end_sync())
            bsp_abort( "bsp_end: Unexpected internal error\n");
        s_spmd->close();
        delete s_spmd;
        s_spmd = NULL;
        std::exit(EXIT_SUCCESS);
    }

    size_t max_msg_size = INT_MAX; 
    if ( bsplib::read_env( "BSPONMPI_MAX_MSG_SIZE", max_msg_size ) 
        || max_msg_size == 0 ) {
        fprintf(stderr, "bsp_begin: WARNING! BSPONMPI_MAX_MSG_SIZE "
                "was not set to a positive, non-zero integer\n");
    }

    int max_small_exchange_size = 
        std::numeric_limits<int>::max() / s_spmd->nprocs() ;
    int small_exch_size = std::min( 1024, max_small_exchange_size ) ;
    if (bsplib::read_env( "BSPONMPI_SMALL_EXCHANGE_SIZE", small_exch_size ) 
        || small_exch_size < 0 
        || small_exch_size > max_small_exchange_size ) {
        fprintf(stderr, "bsp_begin: WARNING! BSPONMPI_SMALL_EXCHANGE_SIZE"
                        " was not an integer between 0 and %d \n",
                        max_small_exchange_size );
    }

    double alpha = 1e+4, beta = 1.0;
    if (bsplib::read_env( "BSPONMPI_P2P_LATENCY", alpha ) || alpha < 0.0) {
        alpha = 1e+4;
        fprintf(stderr, "bsp_begin: BSPONMPI_P2P_LATENCY was not a positive number. Using default: %g\n", alpha);
    }
    if (bsplib::read_env( "BSPONMPI_P2P_MSGGAP", beta ) || beta < 0.0) {
        beta = 1.0;
        fprintf(stderr, "bsp_begin: BSPONMPI_P2P_MSGGAP was not a positive number. Using default: %g\n", beta);
    }
    size_t min_n_hp_msg_size = 0;
    if (bsplib::read_env( "BSPONMPI_P2P_N_HP", min_n_hp_msg_size ) ) {
        min_n_hp_msg_size = 0;
        fprintf(stderr, "bsp_begin: BSPONMPI_P2P_N_HP was not a non-negative integer. Using default %ld\n", (long) min_n_hp_msg_size );
    }

    
    std::string method = "rma";
    if (bsplib::read_env( "BSPONMPI_A2A_METHOD", method ) 
            || ( method != "rma" && method != "msg" ) ) {
        method = "rma";
        fprintf(stderr, "bsp_begin: BSPONMPI_A2A_METHOD was set to "
                "neither 'msg' nor 'rma'. Using default '%s'\n",
                method.c_str() );
    }

    s_rdma = new bsplib::Rdma( s_spmd->comm(), max_msg_size, 
                               small_exch_size, alpha, beta, 
                               min_n_hp_msg_size,
                               method == "rma" ? bsplib::A2A::RMA 
                                               : bsplib::A2A::MSG );
    s_bsmp = new bsplib::Bsmp( s_spmd->comm(), max_msg_size,
                               small_exch_size);
}